

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.hpp
# Opt level: O0

bool httplib::detail::is_valid_path(string *path)

{
  size_t sVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  bool bVar5;
  size_t len;
  size_t beg;
  size_t i;
  size_t level;
  string *path_local;
  
  i = 0;
  beg = 0;
  while( true ) {
    uVar3 = std::__cxx11::string::size();
    bVar5 = false;
    if (beg < uVar3) {
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)path);
      bVar5 = *pcVar4 == '/';
    }
    if (!bVar5) break;
    beg = beg + 1;
  }
  while( true ) {
    sVar1 = beg;
    uVar3 = std::__cxx11::string::size();
    if (uVar3 <= beg) {
      return true;
    }
    while( true ) {
      uVar3 = std::__cxx11::string::size();
      bVar5 = false;
      if (beg < uVar3) {
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)path);
        bVar5 = *pcVar4 != '/';
      }
      if (!bVar5) break;
      beg = beg + 1;
    }
    pcVar4 = (char *)(beg - sVar1);
    if (pcVar4 == (char *)0x0) break;
    iVar2 = std::__cxx11::string::compare((ulong)path,sVar1,pcVar4);
    if (iVar2 != 0) {
      iVar2 = std::__cxx11::string::compare((ulong)path,sVar1,pcVar4);
      if (iVar2 == 0) {
        if (i == 0) {
          return false;
        }
        i = i - 1;
      }
      else {
        i = i + 1;
      }
    }
    while( true ) {
      uVar3 = std::__cxx11::string::size();
      bVar5 = false;
      if (beg < uVar3) {
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)path);
        bVar5 = *pcVar4 == '/';
      }
      if (!bVar5) break;
      beg = beg + 1;
    }
  }
  __assert_fail("len > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/alexgb0[P]restapi-cpp-httplib-example/rest-api-httplib/httplib/httplib.hpp"
                ,0x5d0,"bool httplib::detail::is_valid_path(const std::string &)");
}

Assistant:

inline bool is_valid_path(const std::string& path) {
            size_t level = 0;
            size_t i = 0;

            // Skip slash
            while (i < path.size() && path[i] == '/') {
                i++;
            }

            while (i < path.size()) {
                // Read component
                auto beg = i;
                while (i < path.size() && path[i] != '/') {
                    i++;
                }

                auto len = i - beg;
                assert(len > 0);

                if (!path.compare(beg, len, ".")) {
                    ;
                }
                else if (!path.compare(beg, len, "..")) {
                    if (level == 0) { return false; }
                    level--;
                }
                else {
                    level++;
                }

                // Skip slash
                while (i < path.size() && path[i] == '/') {
                    i++;
                }
            }

            return true;
        }